

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clasp_output.cpp
# Opt level: O0

void __thiscall Clasp::Cli::JsonOutput::visitProblemStats(JsonOutput *this)

{
  ProblemStats *in_stack_00000018;
  JsonOutput *in_stack_00000020;
  
  visitProblemStats(in_stack_00000020,in_stack_00000018);
  return;
}

Assistant:

void JsonOutput::visitProblemStats(const ProblemStats& p) {
	pushObject("Problem");
	printKeyValue("Variables", p.vars.num);
	printKeyValue("Eliminated", p.vars.eliminated);
	printKeyValue("Frozen", p.vars.frozen);
	pushObject("Constraints");
	uint32 sum = p.numConstraints();
	printKeyValue("Sum", sum);
	printKeyValue("Binary", p.constraints.binary);
	printKeyValue("Ternary", p.constraints.ternary);
	popObject(); // Constraints
	printKeyValue("AcycEdges", p.acycEdges);
	popObject(); // PS
}